

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall
QGraphicsProxyWidget::dragLeaveEvent(QGraphicsProxyWidget *this,QGraphicsSceneDragDropEvent *event)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x18);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x208));
  if ((bVar2) && (*(long *)(lVar1 + 0x238) != 0)) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    QDragLeaveEvent::QDragLeaveEvent((QDragLeaveEvent *)&local_28);
    QCoreApplication::sendEvent(*(QObject **)(lVar1 + 0x238),(QEvent *)&local_28);
    *(undefined8 *)(lVar1 + 0x238) = 0;
    QDragLeaveEvent::~QDragLeaveEvent((QDragLeaveEvent *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidget::dragLeaveEvent(QGraphicsSceneDragDropEvent *event)
{
    Q_UNUSED(event);
#if QT_CONFIG(draganddrop)
    Q_D(QGraphicsProxyWidget);
    if (!d->widget || !d->dragDropWidget)
        return;
    QDragLeaveEvent proxyDragLeave;
    QCoreApplication::sendEvent(d->dragDropWidget, &proxyDragLeave);
    d->dragDropWidget = nullptr;
#endif
}